

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

int __thiscall
capnp::compiler::Compiler::CompiledType::clone
          (CompiledType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Compiler *compiler;
  BrandedDecl *t;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *other;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_250;
  BrandedDecl local_1a0;
  undefined1 local_e0 [8];
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  undefined1 local_c8 [8];
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  CompiledType *this_local;
  
  newDecl.value.source._reader._40_8_ = __fn;
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_c8);
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e0,
             *(long *)__fn + 8);
  t = kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::
      get<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>>
                ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)(__fn + 8),
                 (Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e0);
  kj::cp<capnp::compiler::BrandedDecl>(&local_1a0,t);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::
  set<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>>
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_c8,
             (Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e0,
             &local_1a0);
  BrandedDecl::~BrandedDecl(&local_1a0);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e0);
  compiler = *(Compiler **)__fn;
  other = kj::mv<kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>>
                    ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_c8);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded(&local_250,other);
  CompiledType(this,compiler,&local_250);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_250);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_c8);
  return (int)this;
}

Assistant:

Compiler::CompiledType Compiler::CompiledType::clone() {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  {
    auto lock = compiler.impl.lockExclusive();
    newDecl.set(lock, kj::cp(decl.get(lock)));
  }
  return CompiledType(compiler, kj::mv(newDecl));
}